

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O2

void accumulate_gop_stats
               (AV1_COMP *cpi,int is_intra_only,int f_w,int f_h,FIRSTPASS_STATS *next_frame,
               FIRSTPASS_STATS *start_pos,GF_GROUP_STATS *gf_stats,int *idx)

{
  undefined1 auVar1 [16];
  AV1_PRIMARY *pAVar2;
  STATS_BUFFER_CTX *pSVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  FIRSTPASS_STATS *pFVar6;
  int iVar7;
  TWO_PASS_FRAME *twopass_frame;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  
  pAVar2 = cpi->ppi;
  gf_stats->mv_ratio_accumulator = 0.0;
  gf_stats->gf_group_skip_pct = 0.0;
  gf_stats->gf_group_inactive_zone_rows = 0.0;
  gf_stats->gf_group_err = 0.0;
  gf_stats->gf_group_raw_error = 0.0;
  gf_stats->decay_accumulator = 1.0;
  gf_stats->zero_motion_accumulator = 1.0;
  gf_stats->loop_decay_rate = 1.0;
  gf_stats->last_loop_decay_rate = 1.0;
  gf_stats->this_frame_mv_in_out = 0.0;
  gf_stats->mv_in_out_accumulator = 0.0;
  gf_stats->abs_mv_in_out_accumulator = 0.0;
  gf_stats->avg_sr_coded_error = 0.0;
  gf_stats->avg_pcnt_second_ref = 0.0;
  gf_stats->avg_new_mv_count = 0.0;
  gf_stats->avg_wavelet_energy = 0.0;
  gf_stats->avg_raw_err_stdev = 0.0;
  gf_stats->non_zero_stdev_count = 0;
  memset(next_frame,0,0xe8);
  twopass_frame = &cpi->twopass_frame;
  for (iVar7 = is_intra_only; pSVar3 = (pAVar2->twopass).stats_buf_ctx,
      iVar7 < (pAVar2->p_rc).gf_intervals[(pAVar2->p_rc).cur_gf_index]; iVar7 = iVar7 + 1) {
    pFVar6 = pSVar3->stats_in_end;
    if (pFVar6 <= twopass_frame->stats_in) goto LAB_001d9641;
    memcpy(next_frame,twopass_frame->stats_in,0xe8);
    twopass_frame->stats_in = twopass_frame->stats_in + 1;
    dVar8 = calculate_modified_err(&cpi->frame_info,&pAVar2->twopass,&cpi->oxcf,next_frame);
    dVar9 = next_frame->coded_error;
    gf_stats->gf_group_err = gf_stats->gf_group_err + dVar8;
    gf_stats->gf_group_raw_error = gf_stats->gf_group_raw_error + dVar9;
    dVar9 = next_frame->inactive_zone_rows;
    gf_stats->gf_group_skip_pct = next_frame->intra_skip_pct + gf_stats->gf_group_skip_pct;
    gf_stats->gf_group_inactive_zone_rows = dVar9 + gf_stats->gf_group_inactive_zone_rows;
  }
  pFVar6 = pSVar3->stats_in_end;
LAB_001d9641:
  twopass_frame->stats_in = start_pos;
  if (start_pos < pFVar6) {
    memcpy(next_frame,start_pos,0xe8);
    twopass_frame->stats_in = twopass_frame->stats_in + 1;
  }
  while ((iVar7 = (pAVar2->p_rc).gf_intervals[(pAVar2->p_rc).cur_gf_index], is_intra_only < iVar7 &&
         (twopass_frame->stats_in < ((pAVar2->twopass).stats_buf_ctx)->stats_in_end))) {
    memcpy(next_frame,twopass_frame->stats_in,0xe8);
    (cpi->twopass_frame).stats_in = (cpi->twopass_frame).stats_in + 1;
    iVar7 = detect_flash(&pAVar2->twopass,twopass_frame,0);
    accumulate_next_frame_stats
              (next_frame,iVar7,(cpi->rc).frames_since_key,is_intra_only,gf_stats,f_w,f_h);
    is_intra_only = is_intra_only + 1;
  }
  if (iVar7 != 0) {
    dVar9 = (double)iVar7;
    auVar10._0_8_ = gf_stats->avg_sr_coded_error;
    auVar10._8_8_ = gf_stats->avg_pcnt_second_ref;
    auVar1._0_8_ = gf_stats->avg_new_mv_count;
    auVar1._8_8_ = gf_stats->avg_wavelet_energy;
    auVar4._8_8_ = dVar9;
    auVar4._0_8_ = dVar9;
    auVar10 = divpd(auVar10,auVar4);
    gf_stats->avg_sr_coded_error = (double)auVar10._0_8_;
    gf_stats->avg_pcnt_second_ref = (double)auVar10._8_8_;
    auVar5._8_8_ = dVar9;
    auVar5._0_8_ = dVar9;
    auVar10 = divpd(auVar1,auVar5);
    gf_stats->avg_new_mv_count = (double)auVar10._0_8_;
    gf_stats->avg_wavelet_energy = (double)auVar10._8_8_;
  }
  if (gf_stats->non_zero_stdev_count != 0) {
    gf_stats->avg_raw_err_stdev =
         gf_stats->avg_raw_err_stdev / (double)gf_stats->non_zero_stdev_count;
  }
  *idx = iVar7;
  return;
}

Assistant:

static void accumulate_gop_stats(AV1_COMP *cpi, int is_intra_only, int f_w,
                                 int f_h, FIRSTPASS_STATS *next_frame,
                                 const FIRSTPASS_STATS *start_pos,
                                 GF_GROUP_STATS *gf_stats, int *idx) {
  int i, flash_detected;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  RATE_CONTROL *const rc = &cpi->rc;
  FRAME_INFO *frame_info = &cpi->frame_info;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;

  init_gf_stats(gf_stats);
  av1_zero(*next_frame);

  // If this is a key frame or the overlay from a previous arf then
  // the error score / cost of this frame has already been accounted for.
  i = is_intra_only;
  // get the determined gf group length from p_rc->gf_intervals
  while (i < p_rc->gf_intervals[p_rc->cur_gf_index]) {
    // read in the next frame
    if (EOF == input_stats(twopass, &cpi->twopass_frame, next_frame)) break;
    // Accumulate error score of frames in this gf group.
    double mod_frame_err =
        calculate_modified_err(frame_info, twopass, oxcf, next_frame);
    // accumulate stats for this frame
    accumulate_this_frame_stats(next_frame, mod_frame_err, gf_stats);
    ++i;
  }

  reset_fpf_position(&cpi->twopass_frame, start_pos);

  i = is_intra_only;
  input_stats(twopass, &cpi->twopass_frame, next_frame);
  while (i < p_rc->gf_intervals[p_rc->cur_gf_index]) {
    // read in the next frame
    if (EOF == input_stats(twopass, &cpi->twopass_frame, next_frame)) break;

    // Test for the case where there is a brief flash but the prediction
    // quality back to an earlier frame is then restored.
    flash_detected = detect_flash(twopass, &cpi->twopass_frame, 0);

    // accumulate stats for next frame
    accumulate_next_frame_stats(next_frame, flash_detected,
                                rc->frames_since_key, i, gf_stats, f_w, f_h);

    ++i;
  }

  i = p_rc->gf_intervals[p_rc->cur_gf_index];
  average_gf_stats(i, gf_stats);

  *idx = i;
}